

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

bool soul::ASTUtilities::exposeChildEndpoints(Allocator *allocator,Graph *graph)

{
  pointer ppVar1;
  pointer ppVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  UTF8Reader UVar5;
  bool bVar6;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  Graph *graph_00;
  pointer ppVar7;
  EndpointDeclaration *e_00;
  Identifier IVar8;
  Expression *pEVar9;
  PoolItem *pPVar10;
  SharedEndpoint *args_2;
  long *plVar11;
  pointer ppVar12;
  pool_ref<soul::AST::ProcessorInstance> *i;
  Ptr type;
  pool_ref<soul::AST::ProcessorInstance> *i_1;
  long *plVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  string_view newString;
  pool_ptr<soul::AST::ProcessorBase> childProcessor;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *__range3;
  pool_ptr<soul::AST::ProcessorBase> childProcessor_1;
  Context local_a8;
  pool_ref<soul::AST::Connection> local_90;
  InterpolationType local_84;
  Graph *local_80;
  pointer local_78;
  pointer local_70;
  Pool *local_68;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
  *local_60;
  vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
  *local_58;
  long *local_50;
  void *local_48;
  pool_ptr<soul::AST::ProcessorInstance> local_40;
  long *local_38;
  
  ppVar1 = (graph->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar14 = false;
  for (ppVar12 = (graph->processorInstances).
                 super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_80 = graph, ppVar12 != ppVar1;
      ppVar12 = ppVar12 + 1) {
    pEVar9 = (ppVar12->object->targetProcessor).object;
    if (pEVar9 == (Expression *)0x0) goto LAB_0023259e;
    (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_a8);
    if (local_a8.location.sourceCode.object != (SourceCodeText *)0x0) {
      if (local_a8.location.sourceCode.object == (SourceCodeText *)0x0) {
        graph_00 = (Graph *)0x0;
      }
      else {
        graph_00 = (Graph *)__dynamic_cast(local_a8.location.sourceCode.object,
                                           &AST::ProcessorBase::typeinfo,&AST::Graph::typeinfo,0);
      }
      if ((graph_00 != (Graph *)0x0) && (bVar6 = exposeChildEndpoints(allocator,graph_00), bVar6)) {
        bVar14 = true;
      }
    }
    graph = local_80;
  }
  ppVar12 = (graph->processorInstances).
            super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (graph->processorInstances).
             super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 != local_70) {
    local_60 = (vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
                *)&(graph->super_ProcessorBase).endpoints;
    local_68 = &allocator->identifiers;
    local_58 = (vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
                *)&graph->connections;
    do {
      pEVar9 = (ppVar12->object->targetProcessor).object;
      if (pEVar9 == (Expression *)0x0) goto LAB_0023259e;
      local_78 = ppVar12;
      (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_38);
      if (local_38 != (long *)0x0) {
        auVar15 = (**(code **)(*local_38 + 0x40))();
        plVar11 = auVar15._8_8_;
        if (auVar15._0_8_ != plVar11) {
          do {
            local_50 = auVar15._8_8_;
            plVar13 = auVar15._0_8_;
            if (*(char *)(*plVar13 + 0x60) == '\x01') {
              ppVar7 = (graph->super_ProcessorBase).endpoints.
                       super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2 = (graph->super_ProcessorBase).endpoints.
                       super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (ppVar7 != ppVar2) {
                bVar14 = false;
                do {
                  e_00 = ppVar7->object;
                  if ((e_00->isInput == false) &&
                     ((e_00->name).name == *(string **)(*plVar13 + 0x30))) {
                    if (!bVar14) goto LAB_002322ee;
                    break;
                  }
                  ppVar7 = ppVar7 + 1;
                  bVar14 = ppVar7 == ppVar2;
                } while (!bVar14);
              }
              e_00 = (EndpointDeclaration *)0x0;
LAB_002322ee:
              if (e_00 == (EndpointDeclaration *)0x0) {
                local_a8.location.sourceCode.object = (SourceCodeText *)0x0;
                local_a8.location.location.data = (char *)0x0;
                local_a8.parentScope = (Scope *)0x0;
                local_90.object = local_90.object & 0xffffffffffffff00;
                e_00 = PoolAllocator::
                       allocate<soul::AST::EndpointDeclaration,soul::AST::Context,bool>
                                 (&allocator->pool,&local_a8,(bool *)&local_90);
                RefCountedPtr<soul::SourceCodeText>::decIfNotNull
                          (local_a8.location.sourceCode.object);
                puVar3 = *(undefined8 **)(*plVar13 + 0x30);
                if (puVar3 == (undefined8 *)0x0) {
                  IVar8.name = (string *)0x0;
                }
                else {
                  newString._M_str = (char *)*puVar3;
                  newString._M_len = puVar3[1];
                  IVar8 = Identifier::Pool::get(local_68,newString);
                }
                (e_00->name).name = IVar8.name;
                puVar4 = *(undefined4 **)(*plVar13 + 0x38);
                if (puVar4 == (undefined4 *)0x0) goto LAB_00232586;
                pPVar10 = PoolAllocator::allocateSpaceForObject(&allocator->pool,0x38);
                *(undefined4 *)&pPVar10->item = *puVar4;
                ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL>::
                ArrayWithPreallocation
                          ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)
                           &pPVar10->field_0x18,
                           (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_2UL> *)
                           (puVar4 + 2));
                pPVar10[2].size = *(size_t *)(puVar4 + 0xc);
                pPVar10->destructor =
                     PoolAllocator::
                     allocate<soul::AST::EndpointDetails,_soul::AST::EndpointDetails_&>::
                     anon_class_1_0_00000001::__invoke;
                (e_00->details).object = (EndpointDetails *)&pPVar10->item;
                e_00->needsToBeExposedInParent = true;
                local_a8.location.sourceCode.object = (SourceCodeText *)e_00;
                std::
                vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>
                ::emplace_back<soul::pool_ref<soul::AST::EndpointDeclaration>>
                          (local_60,(pool_ref<soul::AST::EndpointDeclaration> *)&local_a8);
                graph = local_80;
              }
              else {
                if (*(EndpointDetails **)(*plVar13 + 0x38) == (EndpointDetails *)0x0) {
LAB_00232586:
                  throwInternalCompilerError("object != nullptr","operator*",0x3b);
                }
                AST::EndpointDetails::getResolvedDataTypes
                          ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_a8,
                           *(EndpointDetails **)(*plVar13 + 0x38));
                UVar5.data = local_a8.location.location.data;
                for (type.object = local_a8.location.sourceCode.object;
                    type.object != (SourceCodeText *)UVar5.data;
                    type.object = (SourceCodeText *)&((type.object)->filename).field_2) {
                  ensureEventEndpointSupportsType(allocator,e_00,(Type *)type.object);
                }
                std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                          ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_a8);
              }
              local_a8.location.sourceCode.object = (SourceCodeText *)0x0;
              local_a8.location.location.data = (char *)0x0;
              local_a8.parentScope = (Scope *)0x0;
              pEVar9 = createEndpointRef(allocator,&local_a8,e_00);
              pPVar10 = PoolAllocator::allocateSpaceForObject(&allocator->pool,8);
              pPVar10->item = pEVar9;
              pPVar10->destructor =
                   PoolAllocator::
                   allocate<soul::AST::Connection::SharedEndpoint,_soul::AST::Expression_&>::
                   anon_class_1_0_00000001::__invoke;
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.location.sourceCode.object)
              ;
              local_a8.location.sourceCode.object = (SourceCodeText *)0x0;
              local_a8.location.location.data = (char *)0x0;
              local_a8.parentScope = (Scope *)0x0;
              local_40.object = local_78->object;
              args_2 = createConnectionEndpoint
                                 (allocator,&local_a8,&local_40,(EndpointDeclaration *)*plVar13);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.location.sourceCode.object)
              ;
              local_a8.parentScope = (Scope *)0x0;
              local_a8.location.sourceCode.object = (SourceCodeText *)0x0;
              local_a8.location.location.data = (char *)0x0;
              local_84 = none;
              local_48 = (void *)0x0;
              local_90.object =
                   PoolAllocator::
                   allocate<soul::AST::Connection,soul::AST::Context,soul::InterpolationType,soul::AST::Connection::SharedEndpoint&,soul::AST::Connection::SharedEndpoint&,decltype(nullptr)>
                             (&allocator->pool,&local_a8,&local_84,args_2,
                              (SharedEndpoint *)&pPVar10->item,&local_48);
              std::
              vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>
              ::emplace_back<soul::pool_ref<soul::AST::Connection>>(local_58,&local_90);
              RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a8.location.sourceCode.object)
              ;
              bVar14 = true;
              plVar11 = local_50;
            }
            auVar15._8_8_ = local_50;
            auVar15._0_8_ = plVar13 + 1;
          } while (plVar13 + 1 != plVar11);
        }
      }
      ppVar12 = local_78 + 1;
    } while (ppVar12 != local_70);
  }
  if (bVar14) {
    ppVar1 = (graph->processorInstances).
             super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar12 = (graph->processorInstances).
                   super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar1;
        ppVar12 = ppVar12 + 1) {
      pEVar9 = (ppVar12->object->targetProcessor).object;
      if (pEVar9 == (Expression *)0x0) {
LAB_0023259e:
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      (*(pEVar9->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_a8);
      if (local_a8.location.sourceCode.object != (SourceCodeText *)0x0) {
        auVar15 = (**(code **)(*(long *)&(local_a8.location.sourceCode.object)->
                                         super_RefCountedObject + 0x40))();
        for (plVar11 = auVar15._0_8_; plVar11 != auVar15._8_8_; plVar11 = plVar11 + 1) {
          *(undefined1 *)(*plVar11 + 0x60) = 0;
        }
      }
    }
  }
  return bVar14;
}

Assistant:

static bool exposeChildEndpoints (AST::Allocator& allocator, AST::Graph& graph)
    {
        bool anyChanges = false;

        for (auto& i : graph.processorInstances)
            if (auto childProcessor = i->targetProcessor->getAsProcessor())
                if (auto childGraph = cast<AST::Graph> (childProcessor))
                    if (exposeChildEndpoints (allocator, *childGraph))
                        anyChanges = true;

        for (auto& processorInstance : graph.processorInstances)
        {
            if (auto childProcessor = processorInstance->targetProcessor->getAsProcessor())
            {
                for (auto& childEndpoint : childProcessor->getEndpoints())
                {
                    if (childEndpoint->needsToBeExposedInParent)
                    {
                        auto parentEndpoint = graph.findEndpoint (childEndpoint->name, false);

                        if (parentEndpoint != nullptr)
                        {
                            for (auto& t : childEndpoint->getDetails().getResolvedDataTypes())
                                ensureEventEndpointSupportsType (allocator, *parentEndpoint, t);
                        }
                        else
                        {
                            parentEndpoint = allocator.allocate<AST::EndpointDeclaration> (AST::Context(), false);
                            parentEndpoint->name = allocator.get (childEndpoint->name);
                            parentEndpoint->details = allocator.allocate<AST::EndpointDetails> (childEndpoint->getDetails());
                            parentEndpoint->needsToBeExposedInParent = true;
                            graph.endpoints.push_back (*parentEndpoint);
                        }

                        auto& parent = allocator.allocate<AST::Connection::SharedEndpoint> (createEndpointRef (allocator, {}, *parentEndpoint));
                        auto& child = createConnectionEndpoint (allocator, {}, processorInstance, childEndpoint);

                        graph.connections.push_back (allocator.allocate<AST::Connection> (AST::Context(), InterpolationType::none,
                                                                                          child, parent, nullptr));
                        anyChanges = true;
                    }
                }
            }
        }

        if (anyChanges)
            for (auto& i : graph.processorInstances)
                if (auto childProcessor = i->targetProcessor->getAsProcessor())
                    for (auto& childEndpoint : childProcessor->getEndpoints())
                        childEndpoint->needsToBeExposedInParent = false;

        return anyChanges;
    }